

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.h
# Opt level: O3

string * __thiscall hwnet::Addr::ToStr_abi_cxx11_(string *__return_storage_ptr__,Addr *this)

{
  ushort uVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char acStack_58 [8];
  char ip [32];
  char ret [32];
  
  if (this->addrType == 1) {
    ip[8] = '\0';
    ip[9] = '\0';
    ip[10] = '\0';
    ip[0xb] = '\0';
    ip[0xc] = '\0';
    ip[0xd] = '\0';
    ip[0xe] = '\0';
    ip[0xf] = '\0';
    ip[0x10] = '\0';
    ip[0x11] = '\0';
    ip[0x12] = '\0';
    ip[0x13] = '\0';
    ip[0x14] = '\0';
    ip[0x15] = '\0';
    ip[0x16] = '\0';
    ip[0x17] = '\0';
    acStack_58[0] = '\0';
    acStack_58[1] = '\0';
    acStack_58[2] = '\0';
    acStack_58[3] = '\0';
    acStack_58[4] = '\0';
    acStack_58[5] = '\0';
    acStack_58[6] = '\0';
    acStack_58[7] = '\0';
    ip[0] = '\0';
    ip[1] = '\0';
    ip[2] = '\0';
    ip[3] = '\0';
    ip[4] = '\0';
    ip[5] = '\0';
    ip[6] = '\0';
    ip[7] = '\0';
    ip[0x18] = '\0';
    ip[0x19] = '\0';
    ip[0x1a] = '\0';
    ip[0x1b] = '\0';
    ip[0x1c] = '\0';
    ip[0x1d] = '\0';
    ip[0x1e] = '\0';
    ip[0x1f] = '\0';
    uVar1 = (this->sockaddr).in.sin_port;
    pcVar2 = inet_ntop(this->family,(void *)((long)&this->sockaddr + 4),acStack_58,0x20);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = ip + 0x18;
      snprintf(pcVar2,0x20,"%s:%d",acStack_58,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar3 = strlen(pcVar2);
      pcVar4 = ip + sVar3 + 0x18;
      goto LAB_00112827;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = "";
  pcVar2 = "";
LAB_00112827:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string ToStr() const {
        if(this->addrType == SOCK_ADDR_IPV4) {
            char ip[32] = {0};
            char ret[32] = {0};
            auto port = ntohs(this->sockaddr.in.sin_port);
            if(NULL == ::inet_ntop(this->family,(const char*)&this->sockaddr.in.sin_addr,ip,sizeof(ip))){
                return std::string("");
            } else {
                snprintf(ret,32,"%s:%d",ip,port);
                return std::string(ret);
            }
        }
        return std::string("");
    }